

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_tar_hardlink.c
# Opt level: O3

void test_compat_tar_hardlink(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive *a;
  char *pcVar4;
  int64_t iVar5;
  time_t tVar6;
  archive_entry *ae;
  char name [31];
  archive_entry *local_60;
  char local_58 [40];
  
  builtin_strncpy(local_58,"test_compat_tar_hardlink_1.tar",0x1f);
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                   ,L'5',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0)
  ;
  iVar1 = archive_read_support_filter_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'6',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'7',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  extract_reference_file(local_58);
  wVar2 = archive_read_open_filename(a,local_58,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'9',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 10240)",
                      a);
  iVar1 = archive_read_next_header(a,&local_60);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'<',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_60);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
             ,L'>',"xmcd-3.3.2/docs_d/READMf","\"xmcd-3.3.2/docs_d/READMf\"",pcVar4,
             "archive_entry_pathname(ae)",(void *)0x0,L'\0');
  pcVar4 = archive_entry_hardlink(local_60);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
             ,L'?',(char *)0x0,"NULL",pcVar4,"archive_entry_hardlink(ae)",(void *)0x0,L'\0');
  iVar5 = archive_entry_size(local_60);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'@',0x141,"321",iVar5,"archive_entry_size(ae)",(void *)0x0);
  tVar6 = archive_entry_mtime(local_60);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'A',0x4086cb1d,"1082575645",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  iVar5 = archive_entry_uid(local_60);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'B',0x73b,"1851",iVar5,"archive_entry_uid(ae)",(void *)0x0);
  iVar5 = archive_entry_gid(local_60);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'C',3,"3",iVar5,"archive_entry_gid(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(local_60);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'D',0x8124,"0100444",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  iVar1 = archive_read_next_header(a,&local_60);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'G',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_60);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
             ,L'I',"xmcd-3.3.2/README","\"xmcd-3.3.2/README\"",pcVar4,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  pcVar4 = archive_entry_hardlink(local_60);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
             ,L'L',"xmcd-3.3.2/docs_d/READMf","\"xmcd-3.3.2/docs_d/READMf\"",pcVar4,
             "archive_entry_hardlink(ae)",(void *)0x0,L'\0');
  iVar5 = archive_entry_size(local_60);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'M',0,"0",iVar5,"archive_entry_size(ae)",(void *)0x0);
  tVar6 = archive_entry_mtime(local_60);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'N',0x4086cb1d,"1082575645",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  iVar5 = archive_entry_uid(local_60);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'O',0x73b,"1851",iVar5,"archive_entry_uid(ae)",(void *)0x0);
  iVar5 = archive_entry_gid(local_60);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'P',3,"3",iVar5,"archive_entry_gid(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(local_60);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'Q',0x8124,"0100444",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  iVar1 = archive_read_next_header(a,&local_60);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'Y',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_filter_code(a,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'\\',(long)iVar1,"archive_filter_code(a, 0)",0,"ARCHIVE_FILTER_NONE",
                      (void *)0x0);
  iVar1 = archive_format(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L']',(long)iVar1,"archive_format(a)",0x30000,"ARCHIVE_FORMAT_TAR",(void *)0x0
                     );
  iVar1 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'_',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_tar_hardlink.c"
                      ,L'`',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_compat_tar_hardlink_1(void)
{
	char name[] = "test_compat_tar_hardlink_1.tar";
	struct archive_entry *ae;
	struct archive *a;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 10240));

	/* Read first entry, which is a regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("xmcd-3.3.2/docs_d/READMf",
		archive_entry_pathname(ae));
	assertEqualString(NULL, archive_entry_hardlink(ae));
	assertEqualInt(321, archive_entry_size(ae));
	assertEqualInt(1082575645, archive_entry_mtime(ae));
	assertEqualInt(1851, archive_entry_uid(ae));
	assertEqualInt(3, archive_entry_gid(ae));
	assertEqualInt(0100444, archive_entry_mode(ae));

	/* Read second entry, which is a hard link at the end of archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("xmcd-3.3.2/README",
		archive_entry_pathname(ae));
	assertEqualString(
		"xmcd-3.3.2/docs_d/READMf",
		archive_entry_hardlink(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualInt(1082575645, archive_entry_mtime(ae));
	assertEqualInt(1851, archive_entry_uid(ae));
	assertEqualInt(3, archive_entry_gid(ae));
	assertEqualInt(0100444, archive_entry_mode(ae));

	/* Verify the end-of-archive. */
	/*
	 * This failed in libarchive 2.4.12 because the tar reader
	 * tried to obey the size field for the hard link and ended
	 * up running past the end of the file.
	 */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_NONE);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}